

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_inform_root_about_channel(channel_s *ch,int add)

{
  fio_str_info_s data;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [24];
  fio_msg_internal_s *m_;
  uint32_t local_54;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  char buf [8];
  fio_str_info_s msg;
  fio_str_info_s ch_name;
  int add_local;
  channel_s *ch_local;
  
  if ((((fio_data->is_worker != '\0') && (fio_data->workers != 1)) && (cluster_data.uuid != 0)) &&
     (ch != (channel_s *)0x0)) {
    uVar1 = ch->name_len;
    uVar2 = ch->name;
    auVar3._8_8_ = uVar2;
    auVar3._0_8_ = uVar1;
    memset(buf,0,0x18);
    memset(&local_50,0,8);
    if (ch->match != (fio_match_fn)0x0) {
      local_50 = (undefined1)((ulong)ch->match >> 0x38);
      local_4f = (undefined1)((ulong)ch->match >> 0x30);
      local_4e = (undefined1)((ulong)ch->match >> 0x28);
      local_4d = (undefined1)((ulong)ch->match >> 0x20);
      local_4c = (undefined1)((ulong)ch->match >> 0x18);
      local_4b = (undefined1)((ulong)ch->match >> 0x10);
      local_4a = (undefined1)((ulong)ch->match >> 8);
      local_49 = SUB81(ch->match,0);
      msg.len = (size_t)&local_50;
      msg.capa = 8;
    }
    if (ch->match == (fio_match_fn)0x0) {
      local_54 = 5;
      if (add != 0) {
        local_54 = 4;
      }
    }
    else {
      local_54 = 7;
      if (add != 0) {
        local_54 = 6;
      }
    }
    auVar3._16_8_ = 0;
    data.len = msg.capa;
    data.capa._0_1_ = buf[0];
    data.capa._1_1_ = buf[1];
    data.capa._2_1_ = buf[2];
    data.capa._3_1_ = buf[3];
    data.capa._4_1_ = buf[4];
    data.capa._5_1_ = buf[5];
    data.capa._6_1_ = buf[6];
    data.capa._7_1_ = buf[7];
    data.data = (char *)msg.len;
    m_ = fio_msg_internal_create(0,local_54,(fio_str_info_s)(auVar3 << 0x40),data,'\0','\x01');
    fio_cluster_client_sender(m_,-1);
  }
  return;
}

Assistant:

static inline void fio_cluster_inform_root_about_channel(channel_s *ch,
                                                         int add) {
  if (!fio_data->is_worker || fio_data->workers == 1 || !cluster_data.uuid ||
      !ch)
    return;
  fio_str_info_s ch_name = {.data = ch->name, .len = ch->name_len};
  fio_str_info_s msg = {.data = NULL, .len = 0};
#if DEBUG
  FIO_LOG_DEBUG("(%d) informing root about: %s (%zu) msg type %d",
                (int)getpid(), ch_name.data, ch_name.len,
                (ch->match ? (add ? FIO_CLUSTER_MSG_PATTERN_SUB
                                  : FIO_CLUSTER_MSG_PATTERN_UNSUB)
                           : (add ? FIO_CLUSTER_MSG_PUBSUB_SUB
                                  : FIO_CLUSTER_MSG_PUBSUB_UNSUB)));
#endif
  char buf[8] = {0};
  if (ch->match) {
    fio_u2str64(buf, (uint64_t)ch->match);
    msg.data = buf;
    msg.len = sizeof(ch->match);
  }

  fio_cluster_client_sender(
      fio_msg_internal_create(0,
                              (ch->match
                                   ? (add ? FIO_CLUSTER_MSG_PATTERN_SUB
                                          : FIO_CLUSTER_MSG_PATTERN_UNSUB)
                                   : (add ? FIO_CLUSTER_MSG_PUBSUB_SUB
                                          : FIO_CLUSTER_MSG_PUBSUB_UNSUB)),
                              ch_name, msg, 0, 1),
      -1);
}